

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O1

void Rwt_Man5ExploreStart(void)

{
  Rwr_Man5_t *pRVar1;
  stmm_table *psVar2;
  
  pRVar1 = (Rwr_Man5_t *)malloc(0x10);
  pRVar1->tTableNN = (stmm_table *)0x0;
  pRVar1->tTableNPN = (stmm_table *)0x0;
  psVar2 = stmm_init_table(st__numcmp,st__numhash);
  pRVar1->tTableNN = psVar2;
  psVar2 = stmm_init_table(st__numcmp,st__numhash);
  pRVar1->tTableNPN = psVar2;
  s_pManRwrExp5 = pRVar1;
  return;
}

Assistant:

void Rwt_Man5ExploreStart()
{
    Rwr_Man5_t * p;
    p = ABC_ALLOC( Rwr_Man5_t, 1 );
    memset( p, 0, sizeof(Rwr_Man5_t) );
    p->tTableNN  = stmm_init_table( st__numcmp, st__numhash );
    p->tTableNPN = stmm_init_table( st__numcmp, st__numhash );
    s_pManRwrExp5 = p;

//Extra_PrintHex( stdout, Extra_TruthCanonNPN( 0x0000FFFF, 5 ), 5 );
//printf( "\n" );
}